

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void ncnn::flatten(Mat *src,Mat *dst,Option *opt)

{
  Layer *pLVar1;
  ParamDict pd;
  ParamDict PStack_38;
  
  pLVar1 = create_layer(0xe);
  ParamDict::ParamDict(&PStack_38);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&PStack_38);
  (*pLVar1->_vptr_Layer[4])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst,opt);
  (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  ParamDict::~ParamDict(&PStack_38);
  return;
}

Assistant:

void flatten(const Mat& src, Mat& dst, const Option& opt)
{
    Layer* flatten = create_layer(LayerType::Flatten);

    ParamDict pd;

    flatten->load_param(pd);

    flatten->create_pipeline(opt);

    flatten->forward(src, dst, opt);

    flatten->destroy_pipeline(opt);

    delete flatten;
}